

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O3

bool32 rw::gl3::imageFindRasterFormat
                 (Image *img,int32 type,int32 *pWidth,int32 *pHeight,int32 *pDepth,int32 *pFormat)

{
  int32 iVar1;
  int32 iVar2;
  bool32 bVar3;
  int iVar4;
  uint uVar5;
  
  iVar1 = img->width;
  iVar2 = img->height;
  iVar4 = 0x20;
  if (8 < img->depth) {
    iVar4 = img->depth;
  }
  if (iVar4 == 0x10) {
    uVar5 = 0x100;
  }
  else {
    uVar5 = 0x600;
    if (iVar4 != 0x18) {
      if (iVar4 != 0x20) {
        imageFindRasterFormat();
        return 0;
      }
      bVar3 = Image::hasAlpha(img);
      iVar4 = (uint)(bVar3 != 0) * 8 + 0x18;
      uVar5 = (uint)(bVar3 == 0) * 0x100 + 0x500;
    }
  }
  *pWidth = iVar1;
  *pHeight = iVar2;
  *pDepth = iVar4;
  *pFormat = uVar5 | type;
  return 1;
}

Assistant:

bool32
imageFindRasterFormat(Image *img, int32 type,
	int32 *pWidth, int32 *pHeight, int32 *pDepth, int32 *pFormat)
{
	int32 width, height, depth, format;

	assert((type&0xF) == Raster::TEXTURE);

//	for(width = 1; width < img->width; width <<= 1);
//	for(height = 1; height < img->height; height <<= 1);
	// Perhaps non-power-of-2 textures are acceptable?
	width = img->width;
	height = img->height;

	depth = img->depth;

	if(depth <= 8)
		depth = 32;

	switch(depth){
	case 32:
		if(img->hasAlpha())
			format = Raster::C8888;
		else{
			format = Raster::C888;
			depth = 24;
		}
		break;
	case 24:
		format = Raster::C888;
		break;
	case 16:
		format = Raster::C1555;
		break;

	case 8:
	case 4:
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	format |= type;

	*pWidth = width;
	*pHeight = height;
	*pDepth = depth;
	*pFormat = format;

	return 1;
}